

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O1

void __thiscall
jsonChildren::insert(jsonChildren *this,JSONNode ***position,JSONNode *item,bool reverse)

{
  uint uVar1;
  JSONNode **ppJVar2;
  undefined3 in_register_00000009;
  JSONNode **ppJVar3;
  
  if (CONCAT31(in_register_00000009,reverse) == 0) {
    ppJVar3 = *position;
    ppJVar2 = this->array;
    inc(this);
    ppJVar3 = (JSONNode **)(((long)ppJVar3 - (long)ppJVar2 & 0x7fffffff8U) + (long)this->array);
  }
  else {
    uVar1 = this->mysize;
    ppJVar3 = this->array;
    ppJVar2 = *position;
    inc(this);
    ppJVar3 = (JSONNode **)
              ((long)this->array +
              ((ulong)this->mysize * 8 -
              ((long)ppJVar3 + ((ulong)uVar1 * 8 - (long)ppJVar2) & 0x7fffffff8)));
  }
  *position = ppJVar3;
  uVar1 = this->mysize;
  this->mysize = uVar1 + 1;
  memmove(ppJVar3 + 1,ppJVar3,((ulong)uVar1 - ((ulong)((long)ppJVar3 - (long)this->array) >> 3)) * 8
         );
  **position = item;
  return;
}

Assistant:

void insert(JSONNode ** & position, JSONNode * item, bool reverse = false) json_nothrow {
    #endif
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null insert"));
	   //position isnt relative to array because of realloc
	   JSON_ASSERT(position >= array, JSON_TEXT("position is beneath the start of the array insert 1"));
	   JSON_ASSERT(position <= array + mysize, JSON_TEXT("position is above the end of the array insert 1"));
		#ifndef JSON_LIBRARY
		if (reverse){
			iteratorKeeper<true> ik(this, position);
			inc();
		} else 
		#endif
		{
			iteratorKeeper<false> ik(this, position);
			inc();
		}

	   std::memmove(position + 1, position, (mysize++ - (position - array)) * sizeof(JSONNode *));
	   *position = item;
    }